

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O2

int32_t __thiscall
Assimp::Ogre::OgreXmlSerializer::ReadAttribute<int>(OgreXmlSerializer *this,char *name)

{
  XmlReader *reader;
  int iVar1;
  undefined4 extraout_var;
  allocator local_52;
  allocator local_51;
  string local_50;
  string local_30;
  
  iVar1 = (*this->m_reader->_vptr_IIrrXMLReader[7])();
  reader = this->m_reader;
  if (CONCAT44(extraout_var,iVar1) != 0) {
    iVar1 = (*reader->_vptr_IIrrXMLReader[9])(reader,name);
    return iVar1;
  }
  std::__cxx11::string::string((string *)&local_30,name,&local_51);
  std::__cxx11::string::string((string *)&local_50,"",&local_52);
  ThrowAttibuteError(reader,&local_30,&local_50);
}

Assistant:

int32_t OgreXmlSerializer::ReadAttribute<int32_t>(const char *name) const
{
    if (HasAttribute(name))
    {
        return static_cast<int32_t>(m_reader->getAttributeValueAsInt(name));
    }
    else
    {
        ThrowAttibuteError(m_reader, name);
        return 0;
    }
}